

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatterIntel.c
# Opt level: O2

ZyanStatus
ZydisFormatterIntelPrintMnemonic
          (ZydisFormatter *formatter,ZydisFormatterBuffer *buffer,ZydisFormatterContext *context)

{
  ZydisBranchType ZVar1;
  ZyanStatus ZVar2;
  ZydisShortString *pZVar3;
  ZydisLetterCase letter_case;
  
  if (formatter == (ZydisFormatter *)0x0) {
    __assert_fail("formatter",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/FormatterIntel.c"
                  ,0x10d,
                  "ZyanStatus ZydisFormatterIntelPrintMnemonic(const ZydisFormatter *, ZydisFormatterBuffer *, ZydisFormatterContext *)"
                 );
  }
  if (buffer == (ZydisFormatterBuffer *)0x0) {
    __assert_fail("buffer",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/FormatterIntel.c"
                  ,0x10e,
                  "ZyanStatus ZydisFormatterIntelPrintMnemonic(const ZydisFormatter *, ZydisFormatterBuffer *, ZydisFormatterContext *)"
                 );
  }
  if (context == (ZydisFormatterContext *)0x0) {
    __assert_fail("context",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/FormatterIntel.c"
                  ,0x10f,
                  "ZyanStatus ZydisFormatterIntelPrintMnemonic(const ZydisFormatter *, ZydisFormatterBuffer *, ZydisFormatterContext *)"
                 );
  }
  pZVar3 = ZydisMnemonicGetStringWrapped(context->instruction->mnemonic);
  if (pZVar3 == (ZydisShortString *)0x0) {
    if (buffer->is_token_list == '\0') {
      ZVar2 = ZydisStringAppendShortCase
                        (&buffer->string,&STR_INVALID_MNEMONIC,formatter->case_mnemonic);
    }
    else {
      ZVar2 = ZydisFormatterBufferAppendPredefined
                        (buffer,(ZydisPredefinedToken *)&TOK_DATA_INVALID_MNEMONIC);
    }
    if (-1 < (int)ZVar2) {
      return 0x100000;
    }
    return ZVar2;
  }
  if ((buffer->is_token_list != '\0') &&
     (ZVar2 = ZydisFormatterBufferAppend(buffer,'\x06'), (int)ZVar2 < 0)) {
    return ZVar2;
  }
  ZVar2 = ZydisStringAppendShortCase(&buffer->string,pZVar3,formatter->case_mnemonic);
  if ((int)ZVar2 < 0) {
    return ZVar2;
  }
  ZVar1 = (context->instruction->meta).branch_type;
  if (ZVar1 == ZYDIS_BRANCH_TYPE_FAR) {
    letter_case = formatter->case_mnemonic;
    pZVar3 = &STR_FAR;
  }
  else {
    if (formatter->print_branch_size == '\0') {
      return 0x100000;
    }
    if (ZVar1 == ZYDIS_BRANCH_TYPE_NONE) {
      return 0x100000;
    }
    if (ZVar1 == ZYDIS_BRANCH_TYPE_NEAR) {
      letter_case = formatter->case_mnemonic;
      pZVar3 = &STR_NEAR;
    }
    else {
      if (ZVar1 != ZYDIS_BRANCH_TYPE_SHORT) {
        return 0x80100004;
      }
      letter_case = formatter->case_mnemonic;
      pZVar3 = &STR_SHORT;
    }
  }
  ZVar2 = ZydisStringAppendShortCase(&buffer->string,pZVar3,letter_case);
  return ZVar2;
}

Assistant:

ZyanStatus ZydisFormatterIntelPrintMnemonic(const ZydisFormatter* formatter,
    ZydisFormatterBuffer* buffer, ZydisFormatterContext* context)
{
    ZYAN_ASSERT(formatter);
    ZYAN_ASSERT(buffer);
    ZYAN_ASSERT(context);

    const ZydisShortString* mnemonic = ZydisMnemonicGetStringWrapped(
        context->instruction->mnemonic);
    if (!mnemonic)
    {
        ZYDIS_BUFFER_APPEND_CASE(buffer, INVALID_MNEMONIC, formatter->case_mnemonic);
        return ZYAN_STATUS_SUCCESS;
    }

    ZYDIS_BUFFER_APPEND_TOKEN(buffer, ZYDIS_TOKEN_MNEMONIC);
    ZYAN_CHECK(ZydisStringAppendShortCase(&buffer->string, mnemonic, formatter->case_mnemonic));
    if (context->instruction->meta.branch_type == ZYDIS_BRANCH_TYPE_FAR)
    {
        return ZydisStringAppendShortCase(&buffer->string, &STR_FAR, formatter->case_mnemonic);
    }
    if (formatter->print_branch_size)
    {
        switch (context->instruction->meta.branch_type)
        {
        case ZYDIS_BRANCH_TYPE_NONE:
            break;
        case ZYDIS_BRANCH_TYPE_SHORT:
            return ZydisStringAppendShortCase(&buffer->string, &STR_SHORT,
                formatter->case_mnemonic);
        case ZYDIS_BRANCH_TYPE_NEAR:
            return ZydisStringAppendShortCase(&buffer->string, &STR_NEAR,
                formatter->case_mnemonic);
        default:
            return ZYAN_STATUS_INVALID_ARGUMENT;
        }
    }

    return ZYAN_STATUS_SUCCESS;
}